

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

BCReg parse_params(LexState *ls,int needself)

{
  BCReg nvars;
  int iVar1;
  int in_ESI;
  LexState *in_RDI;
  BCReg nparams;
  FuncState *fs;
  LexState *in_stack_ffffffffffffffc8;
  ErrMsg em;
  undefined4 in_stack_ffffffffffffffd0;
  BCReg in_stack_ffffffffffffffd4;
  LexState *in_stack_ffffffffffffffd8;
  BCReg in_stack_ffffffffffffffe0;
  BCReg BVar2;
  FuncState *str;
  undefined4 in_stack_fffffffffffffff0;
  
  str = in_RDI->fs;
  BVar2 = 0;
  lex_check((LexState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
            (LexToken)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  nvars = BVar2;
  if (in_ESI != 0) {
    nvars = BVar2 + 1;
    in_stack_ffffffffffffffd8 = in_RDI;
    lj_parse_keepstr((LexState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(char *)str,
                     CONCAT44(nvars,BVar2));
    var_new((LexState *)CONCAT44(nvars,BVar2),(BCReg)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
            (GCstr *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    in_stack_ffffffffffffffe0 = BVar2;
  }
  em = (ErrMsg)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (in_RDI->token != 0x29) {
    do {
      em = (ErrMsg)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
      if (in_RDI->token != 0x11f) {
        if (in_RDI->token != 0x118) {
          err_syntax((LexState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),em);
        }
        lj_lex_next((LexState *)0x12e713);
        str->flags = str->flags | 2;
        break;
      }
      BVar2 = nvars + 1;
      in_stack_ffffffffffffffc8 = in_RDI;
      lex_str((LexState *)CONCAT44(nvars,in_stack_ffffffffffffffd0));
      var_new((LexState *)CONCAT44(BVar2,in_stack_ffffffffffffffe0),
              (BCReg)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
              (GCstr *)CONCAT44(nvars,in_stack_ffffffffffffffd0));
      iVar1 = lex_opt(in_stack_ffffffffffffffc8,0);
      em = (ErrMsg)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
      in_stack_ffffffffffffffd4 = nvars;
      nvars = BVar2;
    } while (iVar1 != 0);
  }
  var_add(in_RDI,nvars);
  bcreg_reserve((FuncState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),em);
  lex_check((LexState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),em);
  return nvars;
}

Assistant:

static BCReg parse_params(LexState *ls, int needself)
{
  FuncState *fs = ls->fs;
  BCReg nparams = 0;
  lex_check(ls, '(');
  if (needself)
    var_new_lit(ls, nparams++, "self");
  if (ls->token != ')') {
    do {
      if (ls->token == TK_name || (!LJ_52 && ls->token == TK_goto)) {
	var_new(ls, nparams++, lex_str(ls));
      } else if (ls->token == TK_dots) {
	lj_lex_next(ls);
	fs->flags |= PROTO_VARARG;
	break;
      } else {
	err_syntax(ls, LJ_ERR_XPARAM);
      }
    } while (lex_opt(ls, ','));
  }
  var_add(ls, nparams);
  lua_assert(fs->nactvar == nparams);
  bcreg_reserve(fs, nparams);
  lex_check(ls, ')');
  return nparams;
}